

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags.cc
# Opt level: O3

void __thiscall
google::FlagRegisterer::FlagRegisterer
          (FlagRegisterer *this,char *name,char *type,char *help,char *filename,
          void *current_storage,void *defvalue_storage)

{
  Mutex *pMVar1;
  size_t *psVar2;
  ulong uVar3;
  key_type *__k;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  _Rb_tree_node_base *p_Var6;
  uint uVar7;
  int iVar8;
  char *pcVar9;
  _Base_ptr p_Var10;
  FlagValue *this_00;
  _Base_ptr p_Var11;
  FlagRegistry *pFVar12;
  _Rb_tree_node_base *p_Var13;
  _Base_ptr p_Var14;
  _Rb_tree_node_base *p_Var15;
  _Rb_tree_node_base *p_Var16;
  _Base_ptr p_Var17;
  _Rb_tree_header *p_Var18;
  char *__s2;
  bool bVar19;
  pair<std::_Rb_tree_node_base_*,_std::_Rb_tree_node_base_*> pVar20;
  
  pcVar9 = strchr(type,0x3a);
  if (pcVar9 != (char *)0x0) {
    pcVar9 = strrchr(type,0x3a);
    type = pcVar9 + 1;
  }
  p_Var10 = (_Base_ptr)operator_new(0x10);
  anon_unknown_1::FlagValue::FlagValue((FlagValue *)p_Var10,current_storage,type,false);
  this_00 = (FlagValue *)operator_new(0x10);
  anon_unknown_1::FlagValue::FlagValue(this_00,defvalue_storage,type,false);
  p_Var17 = (_Base_ptr)0x19b57b;
  if (help != (char *)0x0) {
    p_Var17 = (_Base_ptr)help;
  }
  p_Var11 = (_Base_ptr)operator_new(0x38);
  *(char **)p_Var11 = name;
  p_Var11->_M_parent = p_Var17;
  p_Var11->_M_left = (_Base_ptr)filename;
  *(undefined1 *)&p_Var11->_M_right = 0;
  *(FlagValue **)(p_Var11 + 1) = this_00;
  p_Var11[1]._M_parent = p_Var10;
  p_Var11[1]._M_left = (_Base_ptr)0x0;
  pFVar12 = anon_unknown_1::FlagRegistry::GlobalRegistry();
  pMVar1 = &pFVar12->lock_;
  iVar8 = pMVar1->mutex_;
  pMVar1->mutex_ = pMVar1->mutex_ + -1;
  if (iVar8 != 0) {
    __assert_fail("--mutex_ == -1",
                  "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/gflags/src/mutex.h"
                  ,0xde,"void gflags_mutex_namespace::Mutex::Lock()");
  }
  pcVar9 = *(char **)p_Var11;
  p_Var13 = (_Rb_tree_node_base *)operator_new(0x30);
  *(char **)(p_Var13 + 1) = pcVar9;
  p_Var13[1]._M_parent = p_Var11;
  p_Var18 = &(pFVar12->flags_)._M_t._M_impl.super__Rb_tree_header;
  p_Var17 = (pFVar12->flags_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var10 = &p_Var18->_M_header;
  if (p_Var17 == (_Base_ptr)0x0) {
LAB_0018f2b5:
    if (p_Var10 != (pFVar12->flags_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left) {
      p_Var14 = (_Base_ptr)std::_Rb_tree_decrement(p_Var10);
      __s2 = *(char **)(p_Var14 + 1);
      goto LAB_0018f2cf;
    }
LAB_0018f2e2:
    if (p_Var18 == (_Rb_tree_header *)p_Var10) {
      bVar19 = true;
    }
    else {
      iVar8 = strcmp(pcVar9,*(char **)(p_Var10 + 1));
      bVar19 = SUB41((uint)iVar8 >> 0x1f,0);
    }
    std::_Rb_tree_insert_and_rebalance(bVar19,p_Var13,p_Var10,&p_Var18->_M_header);
    psVar2 = &(pFVar12->flags_)._M_t._M_impl.super__Rb_tree_header._M_node_count;
    *psVar2 = *psVar2 + 1;
  }
  else {
    do {
      p_Var14 = p_Var17;
      __s2 = *(char **)(p_Var14 + 1);
      uVar7 = strcmp(pcVar9,__s2);
      p_Var17 = (&p_Var14->_M_left)[~uVar7 >> 0x1f];
    } while ((&p_Var14->_M_left)[~uVar7 >> 0x1f] != (_Base_ptr)0x0);
    p_Var10 = p_Var14;
    if ((int)uVar7 < 0) goto LAB_0018f2b5;
LAB_0018f2cf:
    iVar8 = strcmp(__s2,pcVar9);
    if (iVar8 < 0) goto LAB_0018f2e2;
    operator_delete(p_Var13);
    p_Var17 = (p_Var14[1]._M_parent)->_M_left;
    p_Var10 = p_Var11->_M_left;
    iVar8 = strcmp((char *)p_Var17,(char *)p_Var10);
    if (iVar8 == 0) {
      pcVar9 = 
      "ERROR: something wrong with flag \'%s\' in file \'%s\'.  One possibility: file \'%s\' is being linked both statically and dynamically into this executable.\n"
      ;
      p_Var17 = p_Var10;
    }
    else {
      pcVar9 = "ERROR: flag \'%s\' was defined more than once (in files \'%s\' and \'%s\').\n";
    }
    anon_unknown_1::ReportError(DIE,pcVar9,*(undefined8 *)p_Var11,p_Var17,p_Var10);
  }
  p_Var17 = p_Var11[1]._M_parent;
  p_Var10 = (pFVar12->flags_by_ptr_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var18 = &(pFVar12->flags_by_ptr_)._M_t._M_impl.super__Rb_tree_header;
  bVar19 = true;
  p_Var13 = &p_Var18->_M_header;
  if (p_Var10 != (_Base_ptr)0x0) {
    uVar3 = *(ulong *)p_Var17;
    do {
      if (*(ulong *)(p_Var10 + 1) >= uVar3) {
        p_Var13 = p_Var10;
      }
      p_Var10 = (&p_Var10->_M_left)[*(ulong *)(p_Var10 + 1) < uVar3];
    } while (p_Var10 != (_Base_ptr)0x0);
    if ((_Rb_tree_header *)p_Var13 != p_Var18) {
      if (*(ulong *)(p_Var13 + 1) <= uVar3) goto LAB_0018f47a;
      bVar19 = false;
    }
  }
  p_Var15 = (_Rb_tree_node_base *)operator_new(0x30);
  __k = *(key_type **)p_Var17;
  *(key_type **)(p_Var15 + 1) = __k;
  p_Var15[1]._M_parent = (_Base_ptr)0x0;
  if (bVar19) {
    if (((pFVar12->flags_by_ptr_)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) ||
       (p_Var17 = (pFVar12->flags_by_ptr_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right,
       __k <= *(key_type **)(p_Var17 + 1))) {
LAB_0018f425:
      pVar20 = std::
               _Rb_tree<const_void_*,_std::pair<const_void_*const,_google::(anonymous_namespace)::CommandLineFlag_*>,_std::_Select1st<std::pair<const_void_*const,_google::(anonymous_namespace)::CommandLineFlag_*>_>,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_google::(anonymous_namespace)::CommandLineFlag_*>_>_>
               ::_M_get_insert_unique_pos(&(pFVar12->flags_by_ptr_)._M_t,__k);
LAB_0018f432:
      p_Var13 = pVar20.first;
      if (pVar20.second == (_Rb_tree_node_base *)0x0) {
LAB_0018f461:
        operator_delete(p_Var15);
        goto LAB_0018f47a;
      }
    }
    else {
      auVar5._8_8_ = 0;
      auVar5._0_8_ = p_Var17;
      pVar20 = (pair<std::_Rb_tree_node_base_*,_std::_Rb_tree_node_base_*>)(auVar5 << 0x40);
    }
  }
  else if (__k < *(key_type **)(p_Var13 + 1)) {
    p_Var17 = (pFVar12->flags_by_ptr_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    pVar20.second = p_Var17;
    pVar20.first = p_Var17;
    if (p_Var17 == p_Var13) goto LAB_0018f432;
    p_Var16 = (_Rb_tree_node_base *)std::_Rb_tree_decrement(p_Var13);
    if (__k <= *(key_type **)(p_Var16 + 1)) goto LAB_0018f425;
    p_Var6 = p_Var13;
    if (p_Var16->_M_right == (_Base_ptr)0x0) {
      p_Var13 = p_Var16;
      p_Var6 = (_Rb_tree_node_base *)0x0;
    }
    pVar20.second = p_Var13;
    pVar20.first = p_Var6;
  }
  else {
    if (__k <= *(key_type **)(p_Var13 + 1)) goto LAB_0018f461;
    p_Var17 = (pFVar12->flags_by_ptr_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
    if (p_Var17 == p_Var13) {
      auVar4._8_8_ = 0;
      auVar4._0_8_ = p_Var17;
      pVar20 = (pair<std::_Rb_tree_node_base_*,_std::_Rb_tree_node_base_*>)(auVar4 << 0x40);
      goto LAB_0018f432;
    }
    p_Var16 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var13);
    if (*(key_type **)(p_Var16 + 1) <= __k) goto LAB_0018f425;
    p_Var6 = p_Var16;
    if (p_Var13->_M_right == (_Base_ptr)0x0) {
      p_Var16 = p_Var13;
      p_Var6 = (_Rb_tree_node_base *)0x0;
    }
    pVar20.second = p_Var16;
    pVar20.first = p_Var6;
  }
  p_Var13 = pVar20.second;
  bVar19 = true;
  if ((pVar20.first == (_Rb_tree_node_base *)0x0) && (p_Var18 != (_Rb_tree_header *)p_Var13)) {
    bVar19 = __k < *(key_type **)(p_Var13 + 1);
  }
  std::_Rb_tree_insert_and_rebalance(bVar19,p_Var15,p_Var13,&p_Var18->_M_header);
  psVar2 = &(pFVar12->flags_by_ptr_)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  *psVar2 = *psVar2 + 1;
  p_Var13 = p_Var15;
LAB_0018f47a:
  p_Var13[1]._M_parent = p_Var11;
  pMVar1 = &pFVar12->lock_;
  pMVar1->mutex_ = pMVar1->mutex_ + 1;
  if (pMVar1->mutex_ == 0) {
    return;
  }
  __assert_fail("mutex_++ == -1",
                "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/gflags/src/mutex.h"
                ,0xdf,"void gflags_mutex_namespace::Mutex::Unlock()");
}

Assistant:

FlagRegisterer::FlagRegisterer(const char* name, const char* type,
                               const char* help, const char* filename,
                               void* current_storage, void* defvalue_storage) {
  if (help == NULL)
    help = "";
  // FlagValue expects the type-name to not include any namespace
  // components, so we get rid of those, if any.
  if (strchr(type, ':'))
    type = strrchr(type, ':') + 1;
  FlagValue* current = new FlagValue(current_storage, type, false);
  FlagValue* defvalue = new FlagValue(defvalue_storage, type, false);
  // Importantly, flag_ will never be deleted, so storage is always good.
  CommandLineFlag* flag = new CommandLineFlag(name, help, filename,
                                              current, defvalue);
  FlagRegistry::GlobalRegistry()->RegisterFlag(flag);   // default registry
}